

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int iscleared(TValue *o,int iskey)

{
  bool local_1f;
  bool local_1e;
  bool local_1d;
  int iskey_local;
  TValue *o_local;
  
  if (o->tt < 4) {
    o_local._4_4_ = 0;
  }
  else if (o->tt == 4) {
    (((o->value).gc)->gch).marked = (((o->value).gc)->gch).marked & 0xfc;
    o_local._4_4_ = 0;
  }
  else {
    local_1d = true;
    if (((((o->value).gc)->gch).marked & 3) == 0) {
      local_1e = false;
      if (o->tt == 7) {
        local_1f = false;
        if (iskey == 0) {
          local_1f = ((((o->value).gc)->gch).marked & 8) != 0;
        }
        local_1e = local_1f;
      }
      local_1d = local_1e;
    }
    o_local._4_4_ = (uint)local_1d;
  }
  return o_local._4_4_;
}

Assistant:

static int iscleared(const TValue*o,int iskey){
if(!iscollectable(o))return 0;
if(ttisstring(o)){
stringmark(rawtsvalue(o));
return 0;
}
return iswhite(gcvalue(o))||
(ttisuserdata(o)&&(!iskey&&isfinalized(uvalue(o))));
}